

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O3

void duckdb::Node7Leaf::DeleteByte(ART *art,Node *node,Node *prefix,uint8_t byte,ARTKey *row_id)

{
  byte bVar1;
  BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *pBVar2;
  ulong uVar3;
  
  pBVar2 = BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::DeleteByteInternal(art,node,byte);
  if (pBVar2->count == '\x01') {
    uVar3 = *(ulong *)row_id->data & 0xffffffffffffff ^ 0x80;
    bVar1 = pBVar2->key[0];
    pBVar2->count = '\0';
    Node::Free(art,node);
    if (((prefix->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
      Node::Free(art,prefix);
      node = prefix;
    }
    (node->super_IndexPointer).data =
         (ulong)bVar1 |
         (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38 | 0x700000000000000;
  }
  return;
}

Assistant:

void Node7Leaf::DeleteByte(ART &art, Node &node, Node &prefix, const uint8_t byte, const ARTKey &row_id) {
	auto &n7 = DeleteByteInternal(art, node, byte);

	// Compress one-way nodes.
	if (n7.count == 1) {
		D_ASSERT(node.GetGateStatus() == GateStatus::GATE_NOT_SET);

		// Get the remaining row ID.
		auto remainder = UnsafeNumericCast<idx_t>(row_id.GetRowId()) & AND_LAST_BYTE;
		remainder |= UnsafeNumericCast<idx_t>(n7.key[0]);

		n7.count--;
		Node::Free(art, node);

		if (prefix.GetType() == NType::PREFIX) {
			Node::Free(art, prefix);
			Leaf::New(prefix, UnsafeNumericCast<row_t>(remainder));
		} else {
			Leaf::New(node, UnsafeNumericCast<row_t>(remainder));
		}
	}
}